

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_functions.cpp
# Opt level: O0

ScalarFunction * duckdb::EnumRangeFun::GetFunction(void)

{
  initializer_list<duckdb::LogicalType> iVar1;
  ScalarFunction *in_RDI;
  function_statistics_t in_stack_00000030;
  init_local_state_t in_stack_00000038;
  LogicalType *in_stack_00000040;
  FunctionStability in_stack_00000048;
  FunctionNullHandling in_stack_00000050;
  bind_lambda_function_t in_stack_00000058;
  ScalarFunction *fun;
  allocator_type *in_stack_fffffffffffffea8;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffffeb0;
  _func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  LogicalTypeId in_stack_fffffffffffffecf;
  LogicalType *in_stack_fffffffffffffed0;
  LogicalType *in_stack_fffffffffffffef8;
  undefined8 **local_f0;
  undefined8 *local_50 [3];
  undefined1 **local_38;
  bind_scalar_function_extended_t bind_extended;
  bind_scalar_function_t in_stack_ffffffffffffffd8;
  scalar_function_t *in_stack_ffffffffffffffe0;
  LogicalType *in_stack_ffffffffffffffe8;
  undefined7 in_stack_fffffffffffffff0;
  undefined1 uVar2;
  ScalarFunction *this;
  
  uVar2 = 0;
  this = in_RDI;
  LogicalType::LogicalType(in_stack_fffffffffffffed0,in_stack_fffffffffffffecf);
  local_38 = (undefined1 **)local_50;
  bind_extended = (bind_scalar_function_extended_t)0x1;
  ::std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0x2000771);
  iVar1._M_len._0_4_ = in_stack_fffffffffffffec0;
  iVar1._M_array = (iterator)in_stack_fffffffffffffeb8;
  iVar1._M_len._4_4_ = in_stack_fffffffffffffec4;
  vector<duckdb::LogicalType,_true>::vector
            (in_stack_fffffffffffffeb0,iVar1,in_stack_fffffffffffffea8);
  LogicalType::LogicalType(in_stack_fffffffffffffed0,in_stack_fffffffffffffecf);
  LogicalType::LIST(in_stack_fffffffffffffef8);
  ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),in_stack_fffffffffffffeb8
            );
  LogicalType::LogicalType(in_stack_fffffffffffffed0,in_stack_fffffffffffffecf);
  ScalarFunction::ScalarFunction
            (this,(vector<duckdb::LogicalType,_true> *)CONCAT17(uVar2,in_stack_fffffffffffffff0),
             in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
             bind_extended,in_stack_00000030,in_stack_00000038,in_stack_00000040,in_stack_00000048,
             in_stack_00000050,in_stack_00000058);
  LogicalType::~LogicalType((LogicalType *)0x2000856);
  ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
  ~function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
            0x2000863);
  LogicalType::~LogicalType((LogicalType *)0x2000870);
  LogicalType::~LogicalType((LogicalType *)0x200087d);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x200088a);
  ::std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0x2000897);
  local_f0 = &local_38;
  do {
    local_f0 = local_f0 + -3;
    LogicalType::~LogicalType((LogicalType *)0x20008c0);
  } while (local_f0 != local_50);
  (in_RDI->super_BaseScalarFunction).null_handling = SPECIAL_HANDLING;
  return in_RDI;
}

Assistant:

ScalarFunction EnumRangeFun::GetFunction() {
	auto fun = ScalarFunction({LogicalType::ANY}, LogicalType::LIST(LogicalType::VARCHAR), EnumRangeFunction,
	                          BindEnumFunction);
	fun.null_handling = FunctionNullHandling::SPECIAL_HANDLING;
	return fun;
}